

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O1

void __thiscall tiger::trains::ai::BotSharedData::clear(BotSharedData *this,World *world)

{
  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  _Base_ptr p_Var3;
  int iVar4;
  int iVar5;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar6;
  _Base_ptr p_Var7;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *pvVar8;
  mapped_type *__k;
  Point *pPVar9;
  Player *this_01;
  IPost *pIVar10;
  undefined4 extraout_var;
  _Rb_tree_header *p_Var11;
  pointer ppTVar12;
  pair<std::_Rb_tree_iterator<const_tiger::trains::world::Point_*>,_std::_Rb_tree_iterator<const_tiger::trains::world::Point_*>_>
  pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::_Rb_tree_iterator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  pVar14;
  Train *train;
  Train *local_48;
  HomeChecker *local_40;
  World *local_38;
  
  local_38 = world;
  pvVar6 = trains::world::World::getTrainList(world);
  ppTVar12 = (pvVar6->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (pvVar6->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar12 != ppTVar2) {
    this_00 = &this->trainInPoints;
    p_Var1 = &(this->trainInPoints)._M_t._M_impl.super__Rb_tree_header;
    local_40 = &this->cheker;
    do {
      local_48 = *ppTVar12;
      p_Var3 = (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(Train **)(p_Var3 + 1) < local_48]) {
        if (*(Train **)(p_Var3 + 1) >= local_48) {
          p_Var7 = p_Var3;
        }
      }
      p_Var11 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var11 = (_Rb_tree_header *)p_Var7,
         local_48 < (Train *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var11 = p_Var1;
      }
      if ((p_Var11 != p_Var1) &&
         (pvVar8 = trains::world::Train::getEvents(local_48),
         (pvVar8->
         super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
         )._M_impl.super__Vector_impl_data._M_start !=
         (pvVar8->
         super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
         )._M_impl.super__Vector_impl_data._M_finish)) {
        pvVar8 = trains::world::Train::getEvents(local_48);
        iVar4 = (*(pvVar8->
                  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_IEvent[3])();
        iVar5 = trains::world::World::getTickNum(local_38);
        if (iVar5 + -3 <= iVar4) {
          __k = std::
                map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_48);
          pVar13 = std::
                   _Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                   ::equal_range((_Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                                  *)this,__k);
          std::
          _Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
          ::_M_erase_aux((_Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                          *)this,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
          pVar14 = std::
                   _Rb_tree<const_tiger::trains::world::Train_*,_std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                   ::equal_range(&this_00->_M_t,&local_48);
          std::
          _Rb_tree<const_tiger::trains::world::Train_*,_std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar14.first._M_node,
                         (_Base_ptr)pVar14.second._M_node);
        }
      }
      pPVar9 = trains::world::Train::getPoint(local_48);
      this_01 = trains::world::Train::getPlayer(local_48);
      pIVar10 = trains::world::Player::getHome(this_01);
      iVar4 = (*pIVar10->_vptr_IPost[5])(pIVar10);
      if (pPVar9 == (Point *)CONCAT44(extraout_var,iVar4)) {
        HomeChecker::comeHome(local_40,local_48);
      }
      ppTVar12 = ppTVar12 + 1;
    } while (ppTVar12 != ppTVar2);
  }
  HomeChecker::blockHome(&this->cheker,&this->inPoints);
  return;
}

Assistant:

void BotSharedData::clear(world::World *world)
{
    for (auto train : world->getTrainList())
    {
        if (trainInPoints.count(train) != 0 && !train->getEvents().empty() &&
                train->getEvents().back()->getTick() >= world->getTickNum() - 3)
        {

            inPoints.erase(trainInPoints[train]);
            trainInPoints.erase(train);
        }

        if (train->getPoint() == train->getPlayer()->getHome()->getPoint())
            cheker.comeHome(train);

    }

    cheker.blockHome(inPoints);
}